

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

sexp_conflict sexp_translate_opcode_type(sexp_conflict ctx,sexp_conflict type)

{
  sexp_conflict local_58;
  sexp_conflict tmp;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_38.var = &local_58;
  tmp = (sexp_conflict)0x43e;
  local_58 = type;
  if (type == (sexp_conflict)0x0) {
    local_58 = (sexp_conflict)((((ctx->value).type.setters)->value).port.stream)->_IO_read_end;
  }
  if (((ulong)local_58 & 1) == 0) {
    if (local_58 == (sexp_conflict)0x23e) {
      local_48.next = &local_38;
      local_38.next = (ctx->value).context.saves;
      local_48.var = &tmp;
      (ctx->value).context.saves = &local_48;
      tmp = (sexp_conflict)sexp_intern(ctx,"or",0xffffffffffffffff);
      local_58 = (sexp_conflict)sexp_cons_op(ctx,0,2,0x23e,0x23e);
      local_58 = (sexp_conflict)
                 sexp_cons_op(ctx,0,2,((((ctx->value).type.setters)->value).port.stream)->
                                      _IO_buf_end,local_58);
      local_58 = (sexp_conflict)sexp_cons_op(ctx,0,2,tmp,local_58);
      (ctx->value).context.saves = local_38.next;
    }
  }
  else {
    local_58 = *(sexp_conflict *)
                ((long)&((((ctx->value).type.setters)->value).type.getters)->value +
                ((ulong)local_58 & 0xfffffffffffffffe) * 4 + 8);
  }
  return local_58;
}

Assistant:

static sexp sexp_translate_opcode_type (sexp ctx, sexp type) {
  sexp_gc_var2(res, tmp);
  res = type;
  if (! res) {
    res = sexp_type_by_index(ctx, SEXP_OBJECT);
  } if (sexp_fixnump(res)) {
    res = sexp_type_by_index(ctx, sexp_unbox_fixnum(res));
  } else if (sexp_nullp(res)) {        /* opcode list types */
    sexp_gc_preserve2(ctx, res, tmp);
    tmp = sexp_intern(ctx, "or", -1);
    res = sexp_cons(ctx, SEXP_NULL, SEXP_NULL);
    res = sexp_cons(ctx, sexp_type_by_index(ctx, SEXP_PAIR), res);
    res = sexp_cons(ctx, tmp, res);
    sexp_gc_release2(ctx);
  }
  return res;
}